

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O2

span<const_slang::ast::Expression_*const,_18446744073709551615UL>
slang::ast::bindTerminals
          (SeparatedSyntaxList<slang::syntax::NameSyntax> *syntaxList,SpecifyTerminalDir dir,
          Scope *parentParent,ASTContext *context)

{
  size_t sVar1;
  NameSyntax *syntax;
  undefined4 extraout_var;
  Scope *extraout_RDX;
  Scope *extraout_RDX_00;
  Scope *src;
  __extent_storage<18446744073709551615UL> extraout_RDX_01;
  Compilation *dst;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar2;
  Expression *expr;
  const_iterator __begin2;
  SmallVector<const_slang::ast::Expression_*,_5UL> results;
  Expression *local_88;
  iterator_base<const_slang::syntax::NameSyntax_*> local_80;
  SmallVectorBase<const_slang::ast::Expression_*> local_70 [2];
  
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_80.index = 0;
  local_70[0].cap = 5;
  sVar1 = (syntaxList->elements)._M_extent._M_extent_value;
  src = parentParent;
  local_80.list = syntaxList;
  for (; (local_80.list != syntaxList || (local_80.index != sVar1 + 1 >> 1));
      local_80.index = local_80.index + 1) {
    syntax = slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::
             iterator_base<const_slang::syntax::NameSyntax_*>::dereference(&local_80);
    local_88 = bindTerminal(&syntax->super_ExpressionSyntax,dir,parentParent,context);
    src = extraout_RDX;
    if (local_88 != (Expression *)0x0) {
      SmallVectorBase<slang::ast::Expression_const*>::
      emplace_back<slang::ast::Expression_const*const&>
                ((SmallVectorBase<slang::ast::Expression_const*> *)local_70,&local_88);
      src = extraout_RDX_00;
    }
  }
  dst = ((context->scope).ptr)->compilation;
  sVar2._M_ptr._0_4_ =
       SmallVectorBase<const_slang::ast::Expression_*>::copy
                 (local_70,(EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)src);
  sVar2._M_ptr._4_4_ = extraout_var;
  SmallVectorBase<const_slang::ast::Expression_*>::cleanup(local_70,(EVP_PKEY_CTX *)dst);
  sVar2._M_extent._M_extent_value = extraout_RDX_01._M_extent_value;
  return sVar2;
}

Assistant:

static std::span<const Expression* const> bindTerminals(
    const SeparatedSyntaxList<NameSyntax>& syntaxList, SpecifyBlockSymbol::SpecifyTerminalDir dir,
    const Scope* parentParent, ASTContext& context) {

    SmallVector<const Expression*> results;
    for (auto exprSyntax : syntaxList) {
        auto expr = bindTerminal(*exprSyntax, dir, parentParent, context);
        if (expr)
            results.push_back(expr);
    }
    return results.copy(context.getCompilation());
}